

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

bool MixerContext::sane_layout(cubeb_channel_layout layout)

{
  bool bVar1;
  uint uVar2;
  uint in_EDI;
  undefined1 local_1;
  
  if ((in_EDI & 7) == 0) {
    local_1 = false;
  }
  else {
    bVar1 = even(in_EDI & 3);
    if (bVar1) {
      bVar1 = even(in_EDI & 0x600);
      if (bVar1) {
        bVar1 = even(in_EDI & 0x30);
        if (bVar1) {
          bVar1 = even(in_EDI & 0xc0);
          if (bVar1) {
            uVar2 = cubeb_channel_layout_nb_channels(in_EDI);
            if (uVar2 < 0x20) {
              local_1 = true;
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool sane_layout(cubeb_channel_layout layout)
  {
    if (!(layout & CUBEB_LAYOUT_3F)) { // at least 1 front speaker
      return false;
    }
    if (!even(layout & (CHANNEL_FRONT_LEFT |
                        CHANNEL_FRONT_RIGHT))) { // no asymetric front
      return false;
    }
    if (!even(layout &
              (CHANNEL_SIDE_LEFT | CHANNEL_SIDE_RIGHT))) { // no asymetric side
      return false;
    }
    if (!even(layout & (CHANNEL_BACK_LEFT | CHANNEL_BACK_RIGHT))) {
      return false;
    }
    if (!even(layout &
              (CHANNEL_FRONT_LEFT_OF_CENTER | CHANNEL_FRONT_RIGHT_OF_CENTER))) {
      return false;
    }
    if (cubeb_channel_layout_nb_channels(layout) >= CHANNELS_MAX) {
      return false;
    }
    return true;
  }